

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O2

void __thiscall doctest::detail::Subcase::~Subcase(Subcase *this)

{
  ContextState *pCVar1;
  
  pCVar1 = getContextState::data;
  if (this->m_entered == true) {
    getContextState::data->subcasesCurrentLevel = getContextState::data->subcasesCurrentLevel + -1;
    if (pCVar1->subcasesHasSkipped == false) {
      std::
      _Rb_tree<doctest::detail::SubcaseSignature,doctest::detail::SubcaseSignature,std::_Identity<doctest::detail::SubcaseSignature>,std::less<doctest::detail::SubcaseSignature>,std::allocator<doctest::detail::SubcaseSignature>>
      ::_M_insert_unique<doctest::detail::SubcaseSignature_const&>
                ((_Rb_tree<doctest::detail::SubcaseSignature,doctest::detail::SubcaseSignature,std::_Identity<doctest::detail::SubcaseSignature>,std::less<doctest::detail::SubcaseSignature>,std::allocator<doctest::detail::SubcaseSignature>>
                  *)&pCVar1->subcasesPassed,&this->m_signature);
    }
    if ((pCVar1->subcasesStack).
        super__Vector_base<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (pCVar1->subcasesStack).
        super__Vector_base<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      std::vector<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>::pop_back
                (&pCVar1->subcasesStack);
    }
    (pCVar1->super_TestAccessibleContextState).hasLoggedCurrentTestStart = false;
  }
  return;
}

Assistant:

Subcase::~Subcase() {
        if(m_entered) {
            ContextState* s = getContextState();

            s->subcasesCurrentLevel--;
            // only mark the subcase as passed if no subcases have been skipped
            if(s->subcasesHasSkipped == false)
                s->subcasesPassed.insert(m_signature);

            if(s->subcasesStack.size() > 0)
                s->subcasesStack.pop_back();
            if(s->hasLoggedCurrentTestStart)
                logTestEnd();
            s->hasLoggedCurrentTestStart = false;
        }
    }